

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall sfc::Map::save(Map *this,string *path,bool column_order,uint split_w,uint split_h)

{
  byte_vec_t local_40;
  uint local_24;
  uint local_20;
  uint split_h_local;
  uint split_w_local;
  bool column_order_local;
  string *path_local;
  Map *this_local;
  
  local_24 = split_h;
  local_20 = split_w;
  split_h_local._3_1_ = column_order;
  _split_w_local = path;
  path_local = (string *)this;
  native_data(&local_40,this,column_order,split_w,split_h);
  write_file<unsigned_char>(path,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  return;
}

Assistant:

void Map::save(const std::string& path, bool column_order, unsigned split_w, unsigned split_h) const {
  sfc::write_file(path, native_data(column_order, split_w, split_h));
}